

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isRealTable(Parse *pParse,Table *pTab,int bDrop)

{
  char *pcVar1;
  char *local_30;
  char *zType;
  int bDrop_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  local_30 = (char *)0x0;
  if (pTab->eTabType == '\x02') {
    local_30 = "view";
  }
  if (pTab->eTabType == '\x01') {
    local_30 = "virtual table";
  }
  if (local_30 == (char *)0x0) {
    pParse_local._4_4_ = 0;
  }
  else {
    pcVar1 = "rename columns of";
    if (bDrop != 0) {
      pcVar1 = "drop column from";
    }
    sqlite3ErrorMsg(pParse,"cannot %s %s \"%s\"",pcVar1,local_30,pTab->zName);
    pParse_local._4_4_ = 1;
  }
  return pParse_local._4_4_;
}

Assistant:

static int isRealTable(Parse *pParse, Table *pTab, int bDrop){
  const char *zType = 0;
#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab) ){
    zType = "view";
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    zType = "virtual table";
  }
#endif
  if( zType ){
    sqlite3ErrorMsg(pParse, "cannot %s %s \"%s\"",
        (bDrop ? "drop column from" : "rename columns of"),
        zType, pTab->zName
    );
    return 1;
  }
  return 0;
}